

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
(anonymous_namespace)::InfoWriter::
SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (InfoWriter *this,string *key,
          ConfigStrings<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *cfgStr)

{
  __node_base *p_Var1;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (this,key,&cfgStr->Default);
  p_Var1 = &(cfgStr->Config)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_80.View_._M_str = (key->_M_dataplus)._M_p;
    local_80.View_._M_len = key->_M_string_length;
    local_b0.View_._M_len = 1;
    local_b0.View_._M_str = local_b0.Digits_;
    local_b0.Digits_[0] = '_';
    cmStrCat<std::__cxx11::string>
              (&local_50,&local_80,&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (this,&local_50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(p_Var1 + 5));
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void InfoWriter::SetConfigArray(
  std::string const& key,
  cmQtAutoGenInitializer::ConfigStrings<CONT> const& cfgStr)
{
  this->SetArray(key, cfgStr.Default);
  for (auto const& item : cfgStr.Config) {
    this->SetArray(cmStrCat(key, '_', item.first), item.second);
  }
}